

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SliceBySizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slicebysize(NeuralNetworkLayer *this)

{
  bool bVar1;
  SliceBySizeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_slicebysize(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_slicebysize(this);
    this_00 = (SliceBySizeLayerParams *)operator_new(0x28);
    SliceBySizeLayerParams::SliceBySizeLayerParams(this_00);
    (this->layer_).slicebysize_ = this_00;
  }
  return (SliceBySizeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceBySizeLayerParams* NeuralNetworkLayer::mutable_slicebysize() {
  if (!has_slicebysize()) {
    clear_layer();
    set_has_slicebysize();
    layer_.slicebysize_ = new ::CoreML::Specification::SliceBySizeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sliceBySize)
  return layer_.slicebysize_;
}